

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

int __thiscall Imf_2_5::TiledInputFile::levelHeight(TiledInputFile *this,int ly)

{
  Data *pDVar1;
  int iVar2;
  stringstream _iex_replace_s;
  
  pDVar1 = this->_data;
  iVar2 = levelSize(pDVar1->minY,pDVar1->maxY,ly,(pDVar1->tileDesc).roundingMode);
  return iVar2;
}

Assistant:

int
TiledInputFile::levelHeight (int ly) const
{
    try
    {
        return levelSize (_data->minY, _data->maxY, ly,
                          _data->tileDesc.roundingMode);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error calling levelHeight() on image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}